

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O2

Uri * Uri::Uri::file(Uri *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  string authority;
  string empty;
  string scheme;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"file",(allocator<char> *)&local_68);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88.field_2._M_local_buf[0] = '\0';
  uVar1 = path->_M_string_length;
  if (((uVar1 < 2) || (pcVar2 = (path->_M_dataplus)._M_p, *pcVar2 != '/')) || (pcVar2[1] != '/')) {
    Uri(__return_storage_ptr__,&local_48,&local_88,path,&local_68,&local_68);
  }
  else {
    pcVar4 = pcVar2 + 2;
    pcVar5 = pcVar4;
    for (lVar3 = uVar1 - 2; lVar3 != 0; lVar3 = lVar3 + -1) {
      if (*pcVar5 == '/') {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_a8,pcVar4,pcVar5);
        std::__cxx11::string::operator=((string *)&local_88,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((string *)local_a8,pcVar5,(path->_M_dataplus)._M_p + path->_M_string_length);
        std::__cxx11::string::operator=((string *)path,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
        if (path->_M_string_length == 0) {
          std::__cxx11::string::assign((char *)path);
        }
        Uri(__return_storage_ptr__,&local_48,&local_88,path,&local_68,&local_68);
        goto LAB_00170121;
      }
      pcVar5 = pcVar5 + 1;
    }
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_a8,pcVar4,pcVar2 + uVar1);
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::assign((char *)path);
    Uri(__return_storage_ptr__,&local_48,&local_88,path,&local_68,&local_68);
  }
LAB_00170121:
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Uri Uri::file (string path) {
    string scheme = "file";
    string empty {};
    string authority {};

    if (IS_WINDOWS) {
        forwardToBackslashes(path);
    }

    if (path.length() >= 2 && path[0] == '/' && path[1] == '/') {
        auto end = path.end();
        for (auto itr = path.begin() + 2; itr != end; itr++) {
            if (*itr == '/') {
                authority = string(path.begin() + 2, itr);
                path = string(itr, path.end());
                if (path.empty()) path = "/";

                return Uri { scheme, authority, path, empty, empty };
            }
        }

        authority = string(path.begin() + 2, path.end());
        path = "/";

        return Uri { scheme, authority, path, empty, empty };
    }

    return Uri { scheme, authority, path, empty, empty };
}